

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

double __thiscall soplex::SPxLPBase<double>::maxAbsNzo(SPxLPBase<double> *this,bool unscaled)

{
  int iVar1;
  Item *pIVar2;
  long lVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Nonzero<double> *pNVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (((int)CONCAT71(in_register_00000031,unscaled) == 0) || (this->_isScaled != true)) {
    lVar3 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    if (0 < lVar3) {
      pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
      lVar5 = 0;
      dVar10 = 0.0;
      do {
        iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar5].idx;
        lVar7 = (long)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
        dVar9 = 0.0;
        if (0 < lVar7) {
          uVar6 = lVar7 + 1;
          pNVar8 = pIVar2[iVar1].data.super_SVectorBase<double>.m_elem + lVar7;
          dVar11 = 0.0;
          do {
            pNVar8 = pNVar8 + -1;
            dVar9 = ABS(pNVar8->val);
            if (ABS(pNVar8->val) <= dVar11) {
              dVar9 = dVar11;
            }
            uVar6 = uVar6 - 1;
            dVar11 = dVar9;
          } while (1 < uVar6);
        }
        if (dVar9 <= dVar10) {
          dVar9 = dVar10;
        }
        lVar5 = lVar5 + 1;
        dVar10 = dVar9;
      } while (lVar5 != lVar3);
      return dVar9;
    }
  }
  else if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    uVar6 = 0;
    dVar10 = 0.0;
    do {
      (*this->lp_scaler->_vptr_SPxScaler[0x12])(this->lp_scaler,this,uVar6);
      dVar9 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar10) {
        dVar9 = dVar10;
      }
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
      dVar10 = dVar9;
    } while ((int)uVar4 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    return dVar9;
  }
  return 0.0;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}